

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

StringDictionaryContainer
duckdb::UncompressedStringStorage::GetDictionary(ColumnSegment *segment,BufferHandle *handle)

{
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&handle->node);
  return *(StringDictionaryContainer *)(((handle->node).ptr)->buffer + segment->offset);
}

Assistant:

StringDictionaryContainer UncompressedStringStorage::GetDictionary(ColumnSegment &segment, BufferHandle &handle) {
	auto startptr = handle.Ptr() + segment.GetBlockOffset();
	StringDictionaryContainer container;
	container.size = Load<uint32_t>(startptr);
	container.end = Load<uint32_t>(startptr + sizeof(uint32_t));
	return container;
}